

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicLattice.cpp
# Opt level: O2

void __thiscall OpenMD::CubicLattice::CubicLattice(CubicLattice *this)

{
  Lattice::Lattice(&this->super_Lattice);
  (this->super_Lattice)._vptr_Lattice = (_func_int **)&PTR__Lattice_002c3110;
  (this->super_Lattice).cellLen.super_Vector<double,_3U>.data_[0] = 1.0;
  (this->super_Lattice).cellLen.super_Vector<double,_3U>.data_[1] = 1.0;
  (this->super_Lattice).cellLen.super_Vector<double,_3U>.data_[2] = 1.0;
  this->latticeParam = 1.0;
  return;
}

Assistant:

CubicLattice::CubicLattice() {
    latticeParam = 1.0;

    cellLen[0] = latticeParam;
    cellLen[1] = latticeParam;
    cellLen[2] = latticeParam;
  }